

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int yaml_parser_append_tag_directive
              (yaml_parser_t *parser,yaml_tag_directive_t value,int allow_duplicates,
              yaml_mark_t mark)

{
  yaml_tag_directive_t *pyVar1;
  int iVar2;
  yaml_char_t *local_48;
  yaml_tag_directive_t copy;
  yaml_tag_directive_t *tag_directive;
  int allow_duplicates_local;
  yaml_parser_t *parser_local;
  yaml_tag_directive_t value_local;
  
  memset(&local_48,0,0x10);
  for (copy.prefix = (yaml_char_t *)(parser->tag_directives).start;
      (yaml_tag_directive_t *)copy.prefix != (parser->tag_directives).top;
      copy.prefix = copy.prefix + 0x10) {
    iVar2 = strcmp((char *)value.handle,*(char **)copy.prefix);
    if (iVar2 == 0) {
      if (allow_duplicates == 0) {
        iVar2 = yaml_parser_set_parser_error(parser,"found duplicate %TAG directive",mark);
        return iVar2;
      }
      return 1;
    }
  }
  local_48 = yaml_strdup(value.handle);
  copy.handle = yaml_strdup(value.prefix);
  if ((local_48 == (yaml_char_t *)0x0) || (copy.handle == (yaml_char_t *)0x0)) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    if (((parser->tag_directives).top != (parser->tag_directives).end) ||
       (iVar2 = yaml_stack_extend(&(parser->tag_directives).start,&(parser->tag_directives).top,
                                  &(parser->tag_directives).end), iVar2 != 0)) {
      pyVar1 = (parser->tag_directives).top;
      (parser->tag_directives).top = pyVar1 + 1;
      pyVar1->handle = local_48;
      pyVar1->prefix = copy.handle;
      return 1;
    }
    parser->error = YAML_MEMORY_ERROR;
  }
  yaml_free(local_48);
  yaml_free(copy.handle);
  return 0;
}

Assistant:

static int
yaml_parser_append_tag_directive(yaml_parser_t *parser,
        yaml_tag_directive_t value, int allow_duplicates, yaml_mark_t mark)
{
    yaml_tag_directive_t *tag_directive;
    yaml_tag_directive_t copy = { NULL, NULL };

    for (tag_directive = parser->tag_directives.start;
            tag_directive != parser->tag_directives.top; tag_directive ++) {
        if (strcmp((char *)value.handle, (char *)tag_directive->handle) == 0) {
            if (allow_duplicates)
                return 1;
            return yaml_parser_set_parser_error(parser,
                    "found duplicate %TAG directive", mark);
        }
    }

    copy.handle = yaml_strdup(value.handle);
    copy.prefix = yaml_strdup(value.prefix);
    if (!copy.handle || !copy.prefix) {
        parser->error = YAML_MEMORY_ERROR;
        goto error;
    }

    if (!PUSH(parser, parser->tag_directives, copy))
        goto error;

    return 1;

error:
    yaml_free(copy.handle);
    yaml_free(copy.prefix);
    return 0;
}